

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib573.c
# Opt level: O0

int test(char *URL)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  uint *puVar6;
  char *pcVar7;
  timeval tVar8;
  timeval older;
  timeval older_00;
  int ec_9;
  CURLMcode ec_8;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  uint local_204;
  CURLMcode ec_7;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  double local_40;
  double dbl_epsilon;
  double connect_time;
  int running;
  int res;
  CURLM *m;
  CURL *c;
  char *URL_local;
  
  m = (CURLM *)0x0;
  _running = 0;
  connect_time._4_4_ = 0;
  connect_time._0_4_ = 1;
  dbl_epsilon = 0.0;
  local_40 = 1.0;
  do {
    local_40 = local_40 / 2.0;
  } while (1.0 < local_40 / 2.0 + 1.0);
  c = URL;
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_48 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_48;
  uVar2 = curl_global_init(3);
  pFVar1 = _stderr;
  if (uVar2 != 0) {
    uVar4 = curl_easy_strerror(uVar2);
    fprintf(pFVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
            ,0x33,(ulong)uVar2,uVar4);
    connect_time._4_4_ = uVar2;
  }
  if (connect_time._4_4_ == 0) {
    m = (CURLM *)curl_easy_init();
    if (m == (CURLM *)0x0) {
      fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
              ,0x35);
      connect_time._4_4_ = 0x7c;
    }
    if (connect_time._4_4_ == 0) {
      uVar2 = curl_easy_setopt(m,0x2a,1);
      pFVar1 = _stderr;
      if (uVar2 != 0) {
        uVar4 = curl_easy_strerror(uVar2);
        fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                ,0x37,(ulong)uVar2,uVar4);
        connect_time._4_4_ = uVar2;
      }
      if (connect_time._4_4_ == 0) {
        uVar2 = curl_easy_setopt(m,0x2712,c);
        pFVar1 = _stderr;
        if (uVar2 != 0) {
          uVar4 = curl_easy_strerror(uVar2);
          fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                  ,0x38,(ulong)uVar2,uVar4);
          connect_time._4_4_ = uVar2;
        }
        if (connect_time._4_4_ == 0) {
          libtest_debug_config.nohex = 1;
          libtest_debug_config.tracetime = 1;
          uVar2 = curl_easy_setopt(m,0x276f,&libtest_debug_config);
          pFVar1 = _stderr;
          if (uVar2 != 0) {
            uVar4 = curl_easy_strerror(uVar2);
            fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                    ,0x3c,(ulong)uVar2,uVar4);
            connect_time._4_4_ = uVar2;
          }
          if (connect_time._4_4_ == 0) {
            uVar2 = curl_easy_setopt(m,0x4e7e,libtest_debug_cb);
            pFVar1 = _stderr;
            if (uVar2 != 0) {
              uVar4 = curl_easy_strerror(uVar2);
              fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                      ,0x3d,(ulong)uVar2,uVar4);
              connect_time._4_4_ = uVar2;
            }
            if (connect_time._4_4_ == 0) {
              uVar2 = curl_easy_setopt(m,0x29,1);
              pFVar1 = _stderr;
              if (uVar2 != 0) {
                uVar4 = curl_easy_strerror(uVar2);
                fprintf(pFVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                        ,0x3e,(ulong)uVar2,uVar4);
                connect_time._4_4_ = uVar2;
              }
              if (connect_time._4_4_ == 0) {
                _running = curl_multi_init();
                if (_running == 0) {
                  fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                          ,0x40);
                  connect_time._4_4_ = 0x7b;
                }
                if (connect_time._4_4_ == 0) {
                  uVar2 = curl_multi_add_handle(_running,m);
                  pFVar1 = _stderr;
                  if (uVar2 != 0) {
                    uVar4 = curl_multi_strerror(uVar2);
                    fprintf(pFVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                            ,0x42,(ulong)uVar2,uVar4);
                    connect_time._4_4_ = uVar2;
                  }
                  while (connect_time._4_4_ == 0) {
                    if (connect_time._0_4_ == 0) {
LAB_00102c27:
                      curl_easy_getinfo(m,0x300005,&dbl_epsilon);
                      if (dbl_epsilon < local_40) {
                        fprintf(_stderr,"connect time is < epsilon\n");
                        connect_time._4_4_ = 0x7e;
                      }
                      break;
                    }
                    local_204 = 0xffffff9d;
                    fdread.__fds_bits[0xf] = 0;
                    uVar2 = curl_multi_perform(_running,&connect_time);
                    pFVar1 = _stderr;
                    if (uVar2 == 0) {
                      if ((int)connect_time._0_4_ < 0) {
                        fprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                                ,0x4c,(ulong)connect_time._0_4_);
                        connect_time._4_4_ = 0x7a;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(uVar2);
                      fprintf(pFVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                              ,0x4c,(ulong)uVar2,uVar4);
                      connect_time._4_4_ = uVar2;
                    }
                    if (connect_time._4_4_ != 0) break;
                    tVar8 = tutil_tvnow();
                    older.tv_usec = tv_test_start.tv_usec;
                    older.tv_sec = tv_test_start.tv_sec;
                    lVar5 = tutil_tvdiff(tVar8,older);
                    if (60000 < lVar5) {
                      fprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                              ,0x4e);
                      connect_time._4_4_ = 0x7d;
                    }
                    if (connect_time._4_4_ != 0) break;
                    if (connect_time._0_4_ == 0) goto LAB_00102c27;
                    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                      fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                    }
                    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1)
                    {
                      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                    }
                    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1)
                    {
                      (&ec_7 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
                      (&ec_7 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
                    }
                    uVar2 = curl_multi_fdset(_running,fdwrite.__fds_bits + 0xf,
                                             fdexcep.__fds_bits + 0xf,&ec_7,&local_204);
                    pFVar1 = _stderr;
                    if (uVar2 == 0) {
                      if ((int)local_204 < -1) {
                        fprintf(_stderr,
                                "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                                ,0x57,(ulong)local_204);
                        connect_time._4_4_ = 0x7a;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(uVar2);
                      fprintf(pFVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                              ,0x57,(ulong)uVar2,uVar4);
                      connect_time._4_4_ = uVar2;
                    }
                    if (connect_time._4_4_ != 0) break;
                    iVar3 = select_wrapper(local_204 + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                           (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&ec_7,
                                           (timeval *)(fdread.__fds_bits + 0xf));
                    if (iVar3 == -1) {
                      puVar6 = (uint *)__errno_location();
                      pFVar1 = _stderr;
                      uVar2 = *puVar6;
                      pcVar7 = strerror(uVar2);
                      fprintf(pFVar1,"%s:%d select() failed, with errno %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                              ,0x5b,(ulong)uVar2,pcVar7);
                      connect_time._4_4_ = 0x79;
                    }
                    if (connect_time._4_4_ != 0) break;
                    tVar8 = tutil_tvnow();
                    older_00.tv_usec = tv_test_start.tv_usec;
                    older_00.tv_sec = tv_test_start.tv_sec;
                    lVar5 = tutil_tvdiff(tVar8,older_00);
                    if (60000 < lVar5) {
                      fprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib573.c"
                              ,0x5d);
                      connect_time._4_4_ = 0x7d;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_multi_remove_handle(_running,m);
    curl_multi_cleanup(_running);
    curl_easy_cleanup(m);
    curl_global_cleanup();
    URL_local._4_4_ = connect_time._4_4_;
  }
  else {
    URL_local._4_4_ = connect_time._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running = 1;
  double connect_time = 0.0;
  double dbl_epsilon;

  dbl_epsilon = 1.0;
  do {
    dbl_epsilon /= 2.0;
  } while ((double)(1.0 + (dbl_epsilon/2.0)) > (double)1.0);

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_URL, URL);

  libtest_debug_config.nohex = 1;
  libtest_debug_config.tracetime = 1;
  easy_setopt(c, CURLOPT_DEBUGDATA, &libtest_debug_config);
  easy_setopt(c, CURLOPT_DEBUGFUNCTION, libtest_debug_cb);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  while (running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

  curl_easy_getinfo(c, CURLINFO_CONNECT_TIME, &connect_time);
  if (connect_time < dbl_epsilon) {
    fprintf(stderr, "connect time is < epsilon\n");
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}